

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_handle_lifetime.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZETHandleLifetimeValidation::zetMetricProgrammableGetPropertiesExpPrologue
          (ZETHandleLifetimeValidation *this,
          zet_metric_programmable_exp_handle_t hMetricProgrammable,
          zet_metric_programmable_exp_properties_t *pProperties)

{
  bool bVar1;
  ze_result_t zVar2;
  
  bVar1 = HandleLifetimeValidation::isHandleValid<_zet_metric_programmable_exp_handle_t*>
                    (*(HandleLifetimeValidation **)(context + 0xd48),hMetricProgrammable);
  zVar2 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if (bVar1) {
    zVar2 = ZE_RESULT_SUCCESS;
  }
  return zVar2;
}

Assistant:

ze_result_t
    ZETHandleLifetimeValidation::zetMetricProgrammableGetPropertiesExpPrologue(
        zet_metric_programmable_exp_handle_t hMetricProgrammable,   ///< [in] handle of the metric programmable
        zet_metric_programmable_exp_properties_t* pProperties   ///< [in,out] properties of the metric programmable
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hMetricProgrammable )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }